

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

bool Imf_3_4::anon_unknown_0::readRgba(RgbaInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Header *pHVar4;
  Compression *pCVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int part;
  int iVar9;
  Array<Imf_3_4::Rgba> pixels;
  
  iVar9 = 0;
  while( true ) {
    iVar1 = Imf_3_4::RgbaInputFile::parts();
    if (iVar1 <= iVar9) {
      return false;
    }
    Imf_3_4::RgbaInputFile::setPart((int)in);
    piVar3 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar1 = piVar3[2];
    iVar2 = *piVar3;
    pHVar4 = (Header *)Imf_3_4::RgbaInputFile::header();
    Imf_3_4::calculateBytesPerPixel(pHVar4);
    Imf_3_4::RgbaInputFile::header();
    pCVar5 = (Compression *)Imf_3_4::Header::compression();
    Imf_3_4::numLinesInBuffer(*pCVar5);
    Array<Imf_3_4::Rgba>::Array(&pixels,((long)iVar1 - (long)iVar2) + 1);
    Imf_3_4::RgbaInputFile::setFrameBuffer((Rgba *)in,(ulong)(pixels._data + -(long)iVar2),1);
    if (reduceMemory) {
      uVar8 = (ulong)piVar3[1];
      lVar6 = ((long)piVar3[3] - uVar8) + 1;
      iVar1 = (int)lVar6 >> 0x14;
      iVar2 = (int)((ulong)(((piVar3[2] - *piVar3) + 1) * lVar6) >> 0x1c);
      if (iVar1 <= iVar2) {
        iVar1 = iVar2;
      }
      if (iVar1 < 2) {
        iVar1 = 1;
      }
    }
    else {
      uVar8 = (ulong)(uint)piVar3[1];
      iVar1 = 1;
    }
    while( true ) {
      iVar2 = piVar3[3];
      iVar7 = (int)uVar8;
      if (iVar2 < iVar7) break;
      Imf_3_4::RgbaInputFile::readPixels((int)in);
      uVar8 = (ulong)(uint)(iVar7 + iVar1);
    }
    Array<Imf_3_4::Rgba>::~Array(&pixels);
    if (iVar7 <= iVar2) break;
    iVar9 = iVar9 + 1;
  }
  return true;
}

Assistant:

bool
readRgba (RgbaInputFile& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;

    for (int part = 0; part < in.parts (); ++part)
    {
        in.setPart (part);
        try
        {
            const Box2i& dw = in.dataWindow ();

            uint64_t w = static_cast<uint64_t> (dw.max.x) -
                         static_cast<uint64_t> (dw.min.x) + 1;
            int      dx            = dw.min.x;
            uint64_t bytesPerPixel = calculateBytesPerPixel (in.header ());
            uint64_t numLines = numLinesInBuffer (in.header ().compression ());

            if (reduceMemory &&
                w * bytesPerPixel * numLines > gMaxBytesPerScanline)
            {
                return false;
            }

            Array<Rgba> pixels (w);
            intptr_t    base = reinterpret_cast<intptr_t> (&pixels[0]);
            in.setFrameBuffer (
                reinterpret_cast<Rgba*> (base - dx * sizeof (Rgba)), 1, 0);

            int step = getStep (dw, reduceTime);

            //
            // try reading scanlines. Continue reading scanlines
            // even if an exception is encountered
            //
            for (int y = dw.min.y; y <= dw.max.y; y += step)
            {
                try
                {
                    in.readPixels (y);
                }
                catch (...)
                {
                    threw = true;

                    //
                    // in reduceTime mode, fail immediately - the file is corrupt
                    //
                    if (reduceTime) { return threw; }
                }
            }
        }
        catch (...)
        {
            threw = true;
        }
    }
    return threw;
}